

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTextureAlloc.cpp
# Opt level: O1

void __thiscall GmmLib::GmmTextureCalc::SetTileMode(GmmTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo)

{
  uint32_t uVar1;
  anon_struct_8_44_94931171_for_Info aVar2;
  GMM_TILE_MODE GVar3;
  ulong uVar4;
  
  GmmGetPlatformInfo(this->pGmmLibContext);
  pTexInfo->TileMode = TILE_NONE;
  aVar2 = (pTexInfo->Flags).Info;
  if (((ulong)aVar2 & 0x106000000000) == 0) {
    if (((ulong)aVar2 & 0x81000000000) == 0) {
      if (((ulong)aVar2 >> 0x23 & 1) != 0) {
        (pTexInfo->Flags).Info =
             (anon_struct_8_44_94931171_for_Info)((ulong)aVar2 & 0xffffe78bfff7ffff);
        pTexInfo->TileMode = LEGACY_TILE_X;
        return;
      }
      if (((ulong)aVar2 >> 0x22 & 1) == 0) {
        if ((aVar2._0_4_ >> 0x13 & 1) == 0) {
          return;
        }
        pTexInfo->TileMode = TILE_NONE;
        return;
      }
      (pTexInfo->Flags).Info =
           (anon_struct_8_44_94931171_for_Info)((ulong)aVar2 & 0xffffe787fff7ffff);
    }
    else {
      uVar4 = 0x1000000000;
      if (((uint)(this->pGmmLibContext->SkuTable).field_0 & 0x40) == 0) {
        uVar4 = 0x80000000000;
      }
      (pTexInfo->Flags).Info =
           (anon_struct_8_44_94931171_for_Info)((ulong)aVar2 & 0xffffef93fff7ffff | uVar4);
      if (((uint)(this->pGmmLibContext->SkuTable).field_0 & 0x40) == 0) {
        pTexInfo->TileMode = TILE4;
        return;
      }
    }
    pTexInfo->TileMode = LEGACY_TILE_Y;
    return;
  }
  if (((ulong)aVar2 >> 0x25 & 1) == 0) {
    if (((uint)(this->pGmmLibContext->SkuTable).field_0 & 0x40) == 0) {
      if (((this->pGmmLibContext->SkuTable).field_1.field_0x4 & 8) != 0) {
        switch(pTexInfo->Type) {
        case RESOURCE_1D:
          goto switchD_001b8559_caseD_1;
        case RESOURCE_2D:
        case RESOURCE_CUBE:
          uVar1 = (pTexInfo->MSAA).NumSamples;
          switch(uVar1) {
          case 1:
            goto switchD_001b8578_caseD_1;
          case 2:
            goto switchD_001b8578_caseD_2;
          case 3:
          case 5:
          case 6:
          case 7:
            break;
          case 4:
            goto switchD_001b8578_caseD_4;
          case 8:
            uVar1 = pTexInfo->BitsPerPixel;
            if (uVar1 == 0x20) {
              GVar3 = TILE__64_2D_8X_32bpe;
            }
            else if (uVar1 == 0x40) {
              GVar3 = TILE__64_2D_8X_64bpe;
            }
            else {
              GVar3 = TILE__64_2D_8X_128bpe;
              if (uVar1 != 0x80) {
                GVar3 = (uVar1 == 0x10) + TILE__64_2D_8X_8bpe;
              }
            }
            goto LAB_001b8cf6;
          default:
            if (uVar1 == 0x10) {
              uVar1 = pTexInfo->BitsPerPixel;
              if (uVar1 == 0x20) {
                GVar3 = TILE__64_2D_16X_32bpe;
              }
              else if (uVar1 == 0x40) {
                GVar3 = TILE__64_2D_16X_64bpe;
              }
              else {
                GVar3 = TILE__64_2D_16X_128bpe;
                if (uVar1 != 0x80) {
                  GVar3 = uVar1 == 0x10 | TILE__64_2D_16X_8bpe;
                }
              }
              goto LAB_001b8cf6;
            }
          }
          break;
        case RESOURCE_3D:
          goto switchD_001b8559_caseD_3;
        }
        goto switchD_001b8559_default;
      }
      switch(pTexInfo->Type) {
      case RESOURCE_1D:
switchD_001b8559_caseD_1:
        uVar1 = pTexInfo->BitsPerPixel;
        if (uVar1 == 0x20) {
          GVar3 = TILE__64_1D_32bpe;
        }
        else if (uVar1 == 0x40) {
          GVar3 = TILE__64_1D_64bpe;
        }
        else {
          GVar3 = TILE__64_1D_128bpe;
          if (uVar1 != 0x80) {
            GVar3 = uVar1 == 0x10 | TILE__64_1D_8bpe;
          }
        }
        break;
      case RESOURCE_2D:
      case RESOURCE_CUBE:
        uVar1 = (pTexInfo->MSAA).NumSamples;
        switch(uVar1) {
        case 1:
switchD_001b8578_caseD_1:
          uVar1 = pTexInfo->BitsPerPixel;
          if (uVar1 == 0x20) {
            GVar3 = TILE__64_2D_32bpe;
          }
          else if (uVar1 == 0x40) {
            GVar3 = TILE__64_2D_64bpe;
          }
          else {
            GVar3 = TILE__64_2D_128bpe;
            if (uVar1 != 0x80) {
              GVar3 = (uVar1 == 0x10) + TILE__64_2D_8bpe;
            }
          }
          break;
        case 2:
switchD_001b8578_caseD_2:
          uVar1 = pTexInfo->BitsPerPixel;
          if (uVar1 == 0x20) {
            GVar3 = TILE__64_2D_2X_32bpe;
          }
          else if (uVar1 == 0x40) {
            GVar3 = TILE__64_2D_2X_64bpe;
          }
          else {
            GVar3 = TILE__64_2D_2X_128bpe;
            if (uVar1 != 0x80) {
              GVar3 = uVar1 == 0x10 | TILE__64_2D_2X_8bpe;
            }
          }
          break;
        case 3:
        case 5:
        case 6:
        case 7:
          goto switchD_001b8559_default;
        case 4:
        case 8:
switchD_001b8578_caseD_4:
          uVar1 = pTexInfo->BitsPerPixel;
          if (uVar1 == 0x20) {
            GVar3 = TILE__64_2D_4X_32bpe;
          }
          else if (uVar1 == 0x40) {
            GVar3 = TILE__64_2D_4X_64bpe;
          }
          else {
            GVar3 = TILE__64_2D_4X_128bpe;
            if (uVar1 != 0x80) {
              GVar3 = (uVar1 == 0x10) + TILE__64_2D_4X_8bpe;
            }
          }
          break;
        default:
          if (uVar1 == 0x10) goto switchD_001b8578_caseD_4;
          goto switchD_001b8559_default;
        }
        break;
      case RESOURCE_3D:
switchD_001b8559_caseD_3:
        uVar1 = pTexInfo->BitsPerPixel;
        if (uVar1 == 0x20) {
          GVar3 = TILE__64_3D_32bpe;
        }
        else if (uVar1 == 0x40) {
          GVar3 = TILE__64_3D_64bpe;
        }
        else {
          GVar3 = TILE__64_3D_128bpe;
          if (uVar1 != 0x80) {
            GVar3 = uVar1 == 0x10 | TILE__64_3D_8bpe;
          }
        }
        break;
      default:
        goto switchD_001b8559_default;
      }
      goto LAB_001b8cf6;
    }
    switch(pTexInfo->Type) {
    case RESOURCE_1D:
      uVar1 = pTexInfo->BitsPerPixel;
      if (uVar1 == 0x20) {
        GVar3 = TILE_YS_1D_32bpe;
      }
      else if (uVar1 == 0x40) {
        GVar3 = TILE_YS_1D_64bpe;
      }
      else {
        GVar3 = TILE_YS_1D_128bpe;
        if (uVar1 != 0x80) {
          GVar3 = uVar1 == 0x10 | TILE_YS_1D_8bpe;
        }
      }
      break;
    case RESOURCE_2D:
    case RESOURCE_CUBE:
      uVar1 = (pTexInfo->MSAA).NumSamples;
      switch(uVar1) {
      case 1:
        uVar1 = pTexInfo->BitsPerPixel;
        if (uVar1 == 0x20) {
          GVar3 = TILE_YS_2D_32bpe;
        }
        else if (uVar1 == 0x40) {
          GVar3 = TILE_YS_2D_64bpe;
        }
        else {
          GVar3 = TILE_YS_2D_128bpe;
          if (uVar1 != 0x80) {
            GVar3 = (uVar1 == 0x10) + TILE_YS_2D_8bpe;
          }
        }
        break;
      case 2:
        uVar1 = pTexInfo->BitsPerPixel;
        if (uVar1 == 0x20) {
          GVar3 = TILE_YS_2D_2X_32bpe;
        }
        else if (uVar1 == 0x40) {
          GVar3 = TILE_YS_2D_2X_64bpe;
        }
        else {
          GVar3 = TILE_YS_2D_2X_128bpe;
          if (uVar1 != 0x80) {
            GVar3 = uVar1 == 0x10 | TILE_YS_2D_2X_8bpe;
          }
        }
        break;
      case 3:
      case 5:
      case 6:
      case 7:
        goto switchD_001b8559_default;
      case 4:
        uVar1 = pTexInfo->BitsPerPixel;
        if (uVar1 == 0x20) {
          GVar3 = TILE_YS_2D_4X_32bpe;
        }
        else if (uVar1 == 0x40) {
          GVar3 = TILE_YS_2D_4X_64bpe;
        }
        else {
          GVar3 = TILE_YS_2D_4X_128bpe;
          if (uVar1 != 0x80) {
            GVar3 = (uVar1 == 0x10) + TILE_YS_2D_4X_8bpe;
          }
        }
        break;
      case 8:
        uVar1 = pTexInfo->BitsPerPixel;
        if (uVar1 == 0x20) {
          GVar3 = TILE_YS_2D_8X_32bpe;
        }
        else if (uVar1 == 0x40) {
          GVar3 = TILE_YS_2D_8X_64bpe;
        }
        else {
          GVar3 = TILE_YS_2D_8X_128bpe;
          if (uVar1 != 0x80) {
            GVar3 = uVar1 == 0x10 | TILE_YS_2D_8X_8bpe;
          }
        }
        break;
      default:
        if (uVar1 == 0x10) {
          uVar1 = pTexInfo->BitsPerPixel;
          if (uVar1 == 0x20) {
            GVar3 = TILE_YS_2D_16X_32bpe;
          }
          else if (uVar1 == 0x40) {
            GVar3 = TILE_YS_2D_16X_64bpe;
          }
          else {
            GVar3 = TILE_YS_2D_16X_128bpe;
            if (uVar1 != 0x80) {
              GVar3 = (uVar1 == 0x10) + TILE_YS_2D_16X_8bpe;
            }
          }
          break;
        }
        goto switchD_001b8559_default;
      }
      break;
    case RESOURCE_3D:
      uVar1 = pTexInfo->BitsPerPixel;
      if (uVar1 == 0x20) {
        GVar3 = TILE_YS_3D_32bpe;
      }
      else if (uVar1 == 0x40) {
        GVar3 = TILE_YS_3D_64bpe;
      }
      else {
        GVar3 = TILE_YS_3D_128bpe;
        if (uVar1 != 0x80) {
          GVar3 = uVar1 == 0x10 | TILE_YS_3D_8bpe;
        }
      }
      break;
    default:
      goto switchD_001b8559_default;
    }
LAB_001b8cf6:
    pTexInfo->TileMode = GVar3;
switchD_001b8559_default:
    (pTexInfo->Flags).Info = aVar2;
    if (((uint)(this->pGmmLibContext->SkuTable).field_0 & 0x40) == 0) {
      aVar2 = (anon_struct_8_44_94931171_for_Info)((ulong)aVar2 | 0x100000000000);
    }
    else {
      aVar2 = (anon_struct_8_44_94931171_for_Info)((ulong)aVar2 | 0x4000000000);
    }
    goto LAB_001b8d16;
  }
  switch(pTexInfo->Type) {
  case RESOURCE_1D:
    uVar1 = pTexInfo->BitsPerPixel;
    if (uVar1 == 0x20) {
      GVar3 = TILE_YF_1D_32bpe;
    }
    else if (uVar1 == 0x40) {
      GVar3 = TILE_YF_1D_64bpe;
    }
    else {
      GVar3 = TILE_YF_1D_128bpe;
      if (uVar1 != 0x80) {
        GVar3 = (uVar1 == 0x10) + TILE_YF_1D_8bpe;
      }
    }
    break;
  case RESOURCE_2D:
  case RESOURCE_CUBE:
    uVar1 = (pTexInfo->MSAA).NumSamples;
    switch(uVar1) {
    case 1:
      uVar1 = pTexInfo->BitsPerPixel;
      if (uVar1 == 0x20) {
        GVar3 = TILE_YF_2D_32bpe;
      }
      else if (uVar1 == 0x40) {
        GVar3 = TILE_YF_2D_64bpe;
      }
      else {
        GVar3 = TILE_YF_2D_128bpe;
        if (uVar1 != 0x80) {
          GVar3 = (uVar1 == 0x10) + TILE_YF_2D_8bpe;
        }
      }
      break;
    case 2:
      uVar1 = pTexInfo->BitsPerPixel;
      if (uVar1 == 0x20) {
        GVar3 = TILE_YF_2D_2X_32bpe;
      }
      else if (uVar1 == 0x40) {
        GVar3 = TILE_YF_2D_2X_64bpe;
      }
      else {
        GVar3 = TILE_YF_2D_2X_128bpe;
        if (uVar1 != 0x80) {
          GVar3 = uVar1 == 0x10 | TILE_YF_2D_2X_8bpe;
        }
      }
      break;
    case 3:
    case 5:
    case 6:
    case 7:
      goto switchD_001b85fc_default;
    case 4:
      uVar1 = pTexInfo->BitsPerPixel;
      if (uVar1 == 0x20) {
        GVar3 = TILE_YF_2D_4X_32bpe;
      }
      else if (uVar1 == 0x40) {
        GVar3 = TILE_YF_2D_4X_64bpe;
      }
      else {
        GVar3 = TILE_YF_2D_4X_128bpe;
        if (uVar1 != 0x80) {
          GVar3 = (uVar1 == 0x10) + TILE_YF_2D_4X_8bpe;
        }
      }
      break;
    case 8:
      uVar1 = pTexInfo->BitsPerPixel;
      if (uVar1 == 0x20) {
        GVar3 = TILE_YF_2D_8X_32bpe;
      }
      else if (uVar1 == 0x40) {
        GVar3 = TILE_YF_2D_8X_64bpe;
      }
      else {
        GVar3 = TILE_YF_2D_8X_128bpe;
        if (uVar1 != 0x80) {
          GVar3 = uVar1 == 0x10 | TILE_YF_2D_8X_8bpe;
        }
      }
      break;
    default:
      if (uVar1 == 0x10) {
        uVar1 = pTexInfo->BitsPerPixel;
        if (uVar1 == 0x20) {
          GVar3 = TILE_YF_2D_16X_32bpe;
        }
        else if (uVar1 == 0x40) {
          GVar3 = TILE_YF_2D_16X_64bpe;
        }
        else {
          GVar3 = TILE_YF_2D_16X_128bpe;
          if (uVar1 != 0x80) {
            GVar3 = (uVar1 == 0x10) + TILE_YF_2D_16X_8bpe;
          }
        }
        break;
      }
      goto switchD_001b85fc_default;
    }
    break;
  case RESOURCE_3D:
    uVar1 = pTexInfo->BitsPerPixel;
    if (uVar1 == 0x20) {
      GVar3 = TILE_YF_3D_32bpe;
    }
    else if (uVar1 == 0x40) {
      GVar3 = TILE_YF_3D_64bpe;
    }
    else {
      GVar3 = TILE_YF_3D_128bpe;
      if (uVar1 != 0x80) {
        GVar3 = uVar1 == 0x10 | TILE_YF_3D_8bpe;
      }
    }
    break;
  default:
    goto switchD_001b85fc_default;
  }
  pTexInfo->TileMode = GVar3;
switchD_001b85fc_default:
  aVar2 = (anon_struct_8_44_94931171_for_Info)((ulong)aVar2 & 0xffffffbfffffffff);
LAB_001b8d16:
  (pTexInfo->Flags).Info = aVar2;
  uVar4 = (ulong)aVar2 | 0x1000000000;
  if (((uint)(this->pGmmLibContext->SkuTable).field_0 & 0x40) == 0) {
    uVar4 = (ulong)aVar2 & 0xfffff7f3fff7ffff;
  }
  (pTexInfo->Flags).Info = (anon_struct_8_44_94931171_for_Info)(uVar4 & 0xfffffff3fff7ffff);
  return;
}

Assistant:

void GmmLib::GmmTextureCalc::SetTileMode(GMM_TEXTURE_INFO *pTexInfo)
{
    const GMM_PLATFORM_INFO *pPlatform;

    pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);
    
    pTexInfo->TileMode = TILE_NONE;

    if(pTexInfo->Flags.Info.TiledYf || GMM_IS_64KB_TILE(pTexInfo->Flags))
    {
// clang-format off
        #define SET_TILE_MODE(Tile, Submode)                                                \
        {                                                                                   \
                pTexInfo->TileMode =                                                        \
                    (pTexInfo->BitsPerPixel == 128) ? TILE_##Tile##_##Submode##_128bpe :    \
                    (pTexInfo->BitsPerPixel ==  64) ? TILE_##Tile##_##Submode##_64bpe  :    \
                    (pTexInfo->BitsPerPixel ==  32) ? TILE_##Tile##_##Submode##_32bpe  :    \
                    (pTexInfo->BitsPerPixel ==  16) ? TILE_##Tile##_##Submode##_16bpe  :    \
                                                      TILE_##Tile##_##Submode##_8bpe;       \
        }                                                                                   \

        #define GENERATE_TILE_MODE(T, M1d, M2d, M2d_2x, M2d_4x, M2d_8x, M2d_16x, M3d)            \
        {\
            switch (pTexInfo->Type)\
            {\
                case RESOURCE_1D:\
                    SET_TILE_MODE(T, M1d);\
                    break;\
                case RESOURCE_2D:\
                case RESOURCE_CUBE:\
                    switch (pTexInfo->MSAA.NumSamples)\
                    {\
                    case 1:\
                        SET_TILE_MODE(T, M2d);\
                        break;\
                    case 2:\
                        SET_TILE_MODE(T, M2d_2x);\
                        break;\
                    case 4:\
                        SET_TILE_MODE(T, M2d_4x);\
                        break;\
                    case 8:\
                        SET_TILE_MODE(T, M2d_8x);\
                        break;\
                    case 16:\
                        SET_TILE_MODE(T, M2d_16x);\
                        break;\
                    default:\
                        __GMM_ASSERT(0);\
                    }\
                    break;\
                case RESOURCE_3D:\
                    SET_TILE_MODE(T, M3d);\
                    break;\
                default:\
                    __GMM_ASSERT(0);\
            }\
        }


        // clang-format on
        if(pTexInfo->Flags.Info.TiledYf)
        {
            GENERATE_TILE_MODE(YF, 1D, 2D, 2D_2X, 2D_4X, 2D_8X, 2D_16X, 3D);

            pTexInfo->Flags.Info.TiledYf = 1;
            pTexInfo->Flags.Info.TiledYs = 0;
        }
        else
        {
            if(pGmmLibContext->GetSkuTable().FtrTileY)
            {
                GENERATE_TILE_MODE(YS, 1D, 2D, 2D_2X, 2D_4X, 2D_8X, 2D_16X, 3D);
            }
            else
            {
                if (pGmmLibContext->GetSkuTable().FtrXe2PlusTiling)
                {
                    GENERATE_TILE_MODE(_64, 1D, 2D, 2D_2X, 2D_4X, 2D_8X, 2D_16X, 3D);
                }
                else
                {
                    GENERATE_TILE_MODE(_64, 1D, 2D, 2D_2X, 2D_4X, 2D_4X, 2D_4X, 3D);
                }
            }

            pTexInfo->Flags.Info.TiledYf = 0;
            GMM_SET_64KB_TILE(pTexInfo->Flags, 1, pGmmLibContext);
        }


        GMM_SET_4KB_TILE(pTexInfo->Flags, pGmmLibContext->GetSkuTable().FtrTileY ? 1 : 0, pGmmLibContext);

        pTexInfo->Flags.Info.TiledX = 0;
        pTexInfo->Flags.Info.TiledW = 0;
        pTexInfo->Flags.Info.Linear = 0;
#undef SET_TILE_MODE
    }
    else if(GMM_IS_4KB_TILE(pTexInfo->Flags))
    {
        GMM_SET_4KB_TILE(pTexInfo->Flags, 1, pGmmLibContext);
        pTexInfo->Flags.Info.TiledYf = 0;
        pTexInfo->Flags.Info.TiledYs = 0;
        pTexInfo->Flags.Info.TiledX  = 0;
        pTexInfo->Flags.Info.TiledW  = 0;
        pTexInfo->Flags.Info.Linear  = 0;
        GMM_SET_4KB_TILE_MODE(pTexInfo->TileMode, pGmmLibContext);
    }
    else if(pTexInfo->Flags.Info.TiledX)
    {
        pTexInfo->Flags.Info.TiledY  = 0;
        pTexInfo->Flags.Info.TiledYf = 0;
        pTexInfo->Flags.Info.TiledYs = 0;
        pTexInfo->Flags.Info.TiledX  = 1;
        pTexInfo->Flags.Info.TiledW  = 0;
        pTexInfo->Flags.Info.Linear  = 0;
        pTexInfo->TileMode           = LEGACY_TILE_X;
    }
    else if(pTexInfo->Flags.Info.TiledW)
    {
        pTexInfo->Flags.Info.TiledY  = 0;
        pTexInfo->Flags.Info.TiledYf = 0;
        pTexInfo->Flags.Info.TiledYs = 0;
        pTexInfo->Flags.Info.TiledX  = 0;
        pTexInfo->Flags.Info.TiledW  = 1;
        pTexInfo->Flags.Info.Linear  = 0;
        pTexInfo->TileMode           = LEGACY_TILE_Y;
    }
    else if(pTexInfo->Flags.Info.Linear)
    {
        pTexInfo->Flags.Info.TiledY  = 0;
        pTexInfo->Flags.Info.TiledYf = 0;
        pTexInfo->Flags.Info.TiledYs = 0;
        pTexInfo->Flags.Info.TiledX  = 0;
        pTexInfo->Flags.Info.TiledW  = 0;
        pTexInfo->Flags.Info.Linear  = 1;
        pTexInfo->TileMode           = TILE_NONE;
    }
    else
    {
        GMM_ASSERTDPF(0, "No tiling preference set!");
    }
    
    GMM_ASSERTDPF(pTexInfo->TileMode < GMM_TILE_MODES, "Invalid Tile Mode Set");
}